

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall gulcalc::mode0(gulcalc *this)

{
  bool bVar1;
  int iVar2;
  int *rec;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  int iVar4;
  
  init(this,in_RSI);
  iVar2 = ((uint)(*(int *)&(this->damagebindictionary_vec_->
                           super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                 *(int *)&(this->damagebindictionary_vec_->
                          super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x66666668 + 0x10;
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  rec = (int *)operator_new__((long)iVar3);
  if (this->benchmark_ == true) {
    mode0();
  }
  bVar1 = (*this->iGetrec_)((char *)rec,0xc);
  if (bVar1) {
    iVar3 = -1;
    do {
      (*this->iGetrec_)((char *)(rec + 3),4);
      iVar2 = rec[3];
      (*this->iGetrec_)((char *)(rec + 4),iVar2 * 8);
      iVar4 = *rec;
      if (iVar4 != iVar3) {
        if (0 < iVar3) {
          if (this->benchmark_ == true) {
            outputbenchmark(this,iVar3,false);
          }
          outputcoveragedata(this,iVar3);
          iVar4 = *rec;
        }
        iVar3 = iVar4;
        if (this->rndopt_ == usecachedvector) {
          getRands::clearvec(this->rnd_);
        }
      }
      processrec(this,(char *)rec,iVar2 * 8 + 0x10);
      bVar1 = (*this->iGetrec_)((char *)rec,0xc);
    } while (bVar1);
  }
  if (this->benchmark_ == true) {
    outputbenchmark(this,*rec,false);
  }
  outputcoveragedata(this,*rec);
  if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->itemWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->lossWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->coverageWriter_)(this->cbuf_,1,this->covbufoffset_);
  }
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->correlatedWriter_)(this->corrbuf_,1,this->correlatedbufoffset_);
  }
  operator_delete__(rec);
  return;
}

Assistant:

void gulcalc::mode0()
{
	init();

	size_t total_bins = damagebindictionary_vec_->size();
	const int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);
	int last_event_id = -1;

	char *rec = new char[max_recsize];
	// char rec[max_recsize]; -- not portable will not compile with Microsoft c++ 
	
	damagecdfrec *d = (damagecdfrec *)rec;

	if (benchmark_) outputbenchmark(0, true);

	for (;;)
	{
		char *p = rec;
		bool bSuccess = iGetrec_(p, sizeof(damagecdfrec));
		if (bSuccess == false) break;
		p = p + sizeof(damagecdfrec);
		bSuccess = iGetrec_(p, sizeof(int)); // we now have bin count
		int *q = (int *)p;
		p = p + sizeof(int);
		int recsize = (*q) * sizeof(prob_mean);
		// we should now have damagecdfrec in memory
		bSuccess = iGetrec_(p, recsize);
		recsize += sizeof(damagecdfrec) + sizeof(int);
		if (d->event_id != last_event_id) {
			if (last_event_id > 0) {
				if (benchmark_) outputbenchmark(last_event_id);
				outputcoveragedata(last_event_id);
			}
			last_event_id = d->event_id;						
			if (rndopt_ == rd_option::usecachedvector) rnd_->clearvec();
		}

		processrec(rec, recsize);
	}
	if (benchmark_) outputbenchmark(d->event_id);
	outputcoveragedata(d->event_id);
	if (itemWriter_)  itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (lossWriter_)  lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (coverageWriter_) coverageWriter_(cbuf_, sizeof(unsigned char), covbufoffset_);
	if (correlatedWriter_) correlatedWriter_(corrbuf_, sizeof(unsigned char), correlatedbufoffset_);

	delete[] rec;
}